

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeevents.cpp
# Opt level: O2

void __thiscall YAML::NodeEvents::Setup(NodeEvents *this,node *node)

{
  int iVar1;
  element_type *peVar2;
  bool bVar3;
  value vVar4;
  mapped_type_conflict *pmVar5;
  value_type element;
  const_node_iterator __begin2;
  const_node_iterator __end2;
  node *local_78;
  node *local_70;
  node *local_68;
  const_node_iterator local_60;
  const_node_iterator local_40;
  
  local_60._0_8_ =
       (node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pmVar5 = std::
           map<const_YAML::detail::node_ref_*,_int,_std::less<const_YAML::detail::node_ref_*>,_std::allocator<std::pair<const_YAML::detail::node_ref_*const,_int>_>_>
           ::operator[](&this->m_refCount,(key_type *)&local_60);
  iVar1 = *pmVar5;
  *pmVar5 = iVar1 + 1;
  if (iVar1 < 1) {
    peVar2 = (((node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_pData).
             super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    vVar4 = Undefined;
    if (peVar2->m_isDefined != false) {
      vVar4 = peVar2->m_type;
    }
    if (vVar4 == Map) {
      detail::node::begin(&local_60,node);
      detail::node::end(&local_40,node);
      while( true ) {
        bVar3 = detail::node_iterator_base<YAML::detail::node_const>::operator!=
                          ((node_iterator_base<YAML::detail::node_const> *)&local_60,&local_40);
        if (!bVar3) break;
        detail::node_iterator_base<const_YAML::detail::node>::operator*(&local_60);
        Setup(this,local_78);
        Setup(this,local_70);
        detail::node_iterator_base<const_YAML::detail::node>::operator++(&local_60);
      }
    }
    else if (vVar4 == Sequence) {
      detail::node::begin(&local_60,node);
      detail::node::end(&local_40,node);
      while( true ) {
        bVar3 = detail::node_iterator_base<YAML::detail::node_const>::operator!=
                          ((node_iterator_base<YAML::detail::node_const> *)&local_60,&local_40);
        if (!bVar3) break;
        detail::node_iterator_base<const_YAML::detail::node>::operator*(&local_60);
        Setup(this,local_68);
        detail::node_iterator_base<const_YAML::detail::node>::operator++(&local_60);
      }
    }
  }
  return;
}

Assistant:

void NodeEvents::Setup(const detail::node& node) {
  int& refCount = m_refCount[node.ref()];
  refCount++;
  if (refCount > 1)
    return;

  if (node.type() == NodeType::Sequence) {
    for (auto element : node)
      Setup(*element);
  } else if (node.type() == NodeType::Map) {
    for (auto element : node) {
      Setup(*element.first);
      Setup(*element.second);
    }
  }
}